

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

int Vec_IntDoubleWidth(Vec_Int_t *p,int nWords)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __nmemb;
  
  iVar5 = p->nSize;
  __nmemb = (long)iVar5 * 2;
  piVar1 = (int *)calloc(__nmemb,4);
  if (iVar5 % nWords == 0) {
    uVar3 = 0;
    uVar4 = 0;
    if (0 < nWords) {
      uVar4 = (ulong)(uint)nWords;
    }
    uVar2 = (long)iVar5 / (long)nWords & 0xffffffff;
    if ((int)((long)iVar5 / (long)nWords) < 1) {
      uVar2 = uVar3;
    }
    iVar5 = 0;
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        piVar1[(long)iVar5 + uVar7] = *(int *)((long)p->pArray + uVar7 * 4 + uVar3);
      }
      iVar5 = iVar5 + nWords * 2;
      uVar3 = uVar3 + (long)nWords * 4;
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      __nmemb = (size_t)(uint)(p->nSize * 2);
    }
    p->pArray = piVar1;
    p->nSize = (int)__nmemb;
    p->nCap = (int)__nmemb;
    return nWords * 2;
  }
  __assert_fail("Vec_IntSize(p) % nWords == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                ,0xf5,"int Vec_IntDoubleWidth(Vec_Int_t *, int)");
}

Assistant:

int Vec_IntDoubleWidth( Vec_Int_t * p, int nWords )
{
    int * pArray = ABC_CALLOC( int, Vec_IntSize(p) * 2 );
    int i, w, nObjs = Vec_IntSize(p) / nWords;
    assert( Vec_IntSize(p) % nWords == 0 );
    for ( i = 0; i < nObjs; i++ )
        for ( w = 0; w < nWords; w++ )
            pArray[2 * nWords * i + w] = p->pArray[nWords * i + w];
    ABC_FREE( p->pArray );
    p->pArray = pArray;
    p->nSize *= 2;
    p->nCap = p->nSize;
    return 2 * nWords;
}